

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ASELoader.cpp
# Opt level: O1

bool __thiscall Assimp::ASEImporter::GenerateNormals(ASEImporter *this,Mesh *mesh)

{
  pointer paVar1;
  pointer paVar2;
  pointer paVar3;
  bool bVar4;
  
  paVar1 = (mesh->super_MeshWithSmoothingGroups<Assimp::ASE::Face>).mNormals.
           super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
           super__Vector_impl_data._M_start;
  paVar2 = (mesh->super_MeshWithSmoothingGroups<Assimp::ASE::Face>).mNormals.
           super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (((paVar1 != paVar2) && (this->configRecomputeNormals == false)) &&
     (bVar4 = paVar1 == paVar2, !bVar4)) {
    if ((paVar1->x == 0.0) && (!NAN(paVar1->x))) {
      while( true ) {
        paVar3 = paVar1 + 1;
        if (((paVar1->y != 0.0) || ((NAN(paVar1->y) || (paVar1->z != 0.0)))) || (NAN(paVar1->z)))
        break;
        bVar4 = paVar3 == paVar2;
        if (bVar4) goto LAB_003e40c8;
        if ((paVar3->x != 0.0) || (paVar1 = paVar3, NAN(paVar3->x))) break;
      }
    }
    if (!bVar4) {
      return true;
    }
  }
LAB_003e40c8:
  ComputeNormalsWithSmoothingsGroups<Assimp::ASE::Face>
            (&mesh->super_MeshWithSmoothingGroups<Assimp::ASE::Face>);
  return false;
}

Assistant:

bool ASEImporter::GenerateNormals(ASE::Mesh& mesh)  {

    if (!mesh.mNormals.empty() && !configRecomputeNormals)
    {
        // Check whether there are only uninitialized normals. If there are
        // some, skip all normals from the file and compute them on our own
        for (std::vector<aiVector3D>::const_iterator qq =  mesh.mNormals.begin();qq != mesh.mNormals.end();++qq) {
            if ((*qq).x || (*qq).y || (*qq).z)
            {
                return true;
            }
        }
    }
    // The array is reused.
    ComputeNormalsWithSmoothingsGroups<ASE::Face>(mesh);
    return false;
}